

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msa_helper.c
# Opt level: O3

void helper_msa_srl_b_mipsel(CPUMIPSState_conflict4 *env,uint32_t wd,uint32_t ws,uint32_t wt)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  char cVar4;
  char cVar6;
  char cVar7;
  char cVar8;
  char cVar9;
  char cVar10;
  char cVar11;
  char cVar12;
  char cVar13;
  char cVar14;
  char cVar15;
  char cVar16;
  char cVar17;
  char cVar18;
  char cVar19;
  undefined1 auVar5 [16];
  char cVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  
  auVar1 = *(undefined1 (*) [16])&(env->active_fpu).fpr[ws].fd;
  auVar5 = psllw((undefined1  [16])(env->active_fpu).fpr[wt],5);
  auVar5 = auVar5 & _DAT_00d835f0;
  cVar4 = auVar5[0];
  auVar21[0] = -(cVar4 < '\0');
  cVar6 = auVar5[1];
  auVar21[1] = -(cVar6 < '\0');
  cVar7 = auVar5[2];
  auVar21[2] = -(cVar7 < '\0');
  cVar8 = auVar5[3];
  auVar21[3] = -(cVar8 < '\0');
  cVar9 = auVar5[4];
  auVar21[4] = -(cVar9 < '\0');
  cVar10 = auVar5[5];
  auVar21[5] = -(cVar10 < '\0');
  cVar11 = auVar5[6];
  auVar21[6] = -(cVar11 < '\0');
  cVar12 = auVar5[7];
  auVar21[7] = -(cVar12 < '\0');
  cVar13 = auVar5[8];
  auVar21[8] = -(cVar13 < '\0');
  cVar14 = auVar5[9];
  auVar21[9] = -(cVar14 < '\0');
  cVar15 = auVar5[10];
  auVar21[10] = -(cVar15 < '\0');
  cVar16 = auVar5[0xb];
  auVar21[0xb] = -(cVar16 < '\0');
  cVar17 = auVar5[0xc];
  auVar21[0xc] = -(cVar17 < '\0');
  cVar18 = auVar5[0xd];
  auVar21[0xd] = -(cVar18 < '\0');
  cVar19 = auVar5[0xe];
  auVar21[0xe] = -(cVar19 < '\0');
  cVar20 = auVar5[0xf];
  auVar21[0xf] = -(cVar20 < '\0');
  auVar5._0_2_ = auVar1._0_2_ >> 4;
  auVar5._2_2_ = auVar1._2_2_ >> 4;
  auVar5._4_2_ = auVar1._4_2_ >> 4;
  auVar5._6_2_ = auVar1._6_2_ >> 4;
  auVar5._8_2_ = auVar1._8_2_ >> 4;
  auVar5._10_2_ = auVar1._10_2_ >> 4;
  auVar5._12_2_ = auVar1._12_2_ >> 4;
  auVar5._14_2_ = auVar1._14_2_ >> 4;
  auVar1 = auVar5 & auVar21 & _DAT_00d835b0 | ~auVar21 & auVar1;
  auVar22[0] = -((char)(cVar4 * '\x02') < '\0');
  auVar22[1] = -((char)(cVar6 * '\x02') < '\0');
  auVar22[2] = -((char)(cVar7 * '\x02') < '\0');
  auVar22[3] = -((char)(cVar8 * '\x02') < '\0');
  auVar22[4] = -((char)(cVar9 * '\x02') < '\0');
  auVar22[5] = -((char)(cVar10 * '\x02') < '\0');
  auVar22[6] = -((char)(cVar11 * '\x02') < '\0');
  auVar22[7] = -((char)(cVar12 * '\x02') < '\0');
  auVar22[8] = -((char)(cVar13 * '\x02') < '\0');
  auVar22[9] = -((char)(cVar14 * '\x02') < '\0');
  auVar22[10] = -((char)(cVar15 * '\x02') < '\0');
  auVar22[0xb] = -((char)(cVar16 * '\x02') < '\0');
  auVar22[0xc] = -((char)(cVar17 * '\x02') < '\0');
  auVar22[0xd] = -((char)(cVar18 * '\x02') < '\0');
  auVar22[0xe] = -((char)(cVar19 * '\x02') < '\0');
  auVar22[0xf] = -((char)(cVar20 * '\x02') < '\0');
  auVar2._0_2_ = auVar1._0_2_ >> 2;
  auVar2._2_2_ = auVar1._2_2_ >> 2;
  auVar2._4_2_ = auVar1._4_2_ >> 2;
  auVar2._6_2_ = auVar1._6_2_ >> 2;
  auVar2._8_2_ = auVar1._8_2_ >> 2;
  auVar2._10_2_ = auVar1._10_2_ >> 2;
  auVar2._12_2_ = auVar1._12_2_ >> 2;
  auVar2._14_2_ = auVar1._14_2_ >> 2;
  auVar1 = auVar2 & auVar22 & _DAT_00d836f0 | ~auVar22 & auVar1;
  auVar23[0] = -((char)(cVar4 << 2) < '\0');
  auVar23[1] = -((char)(cVar6 << 2) < '\0');
  auVar23[2] = -((char)(cVar7 << 2) < '\0');
  auVar23[3] = -((char)(cVar8 << 2) < '\0');
  auVar23[4] = -((char)(cVar9 << 2) < '\0');
  auVar23[5] = -((char)(cVar10 << 2) < '\0');
  auVar23[6] = -((char)(cVar11 << 2) < '\0');
  auVar23[7] = -((char)(cVar12 << 2) < '\0');
  auVar23[8] = -((char)(cVar13 << 2) < '\0');
  auVar23[9] = -((char)(cVar14 << 2) < '\0');
  auVar23[10] = -((char)(cVar15 << 2) < '\0');
  auVar23[0xb] = -((char)(cVar16 << 2) < '\0');
  auVar23[0xc] = -((char)(cVar17 << 2) < '\0');
  auVar23[0xd] = -((char)(cVar18 << 2) < '\0');
  auVar23[0xe] = -((char)(cVar19 << 2) < '\0');
  auVar23[0xf] = -((char)(cVar20 << 2) < '\0');
  auVar3._0_2_ = auVar1._0_2_ >> 1;
  auVar3._2_2_ = auVar1._2_2_ >> 1;
  auVar3._4_2_ = auVar1._4_2_ >> 1;
  auVar3._6_2_ = auVar1._6_2_ >> 1;
  auVar3._8_2_ = auVar1._8_2_ >> 1;
  auVar3._10_2_ = auVar1._10_2_ >> 1;
  auVar3._12_2_ = auVar1._12_2_ >> 1;
  auVar3._14_2_ = auVar1._14_2_ >> 1;
  (env->active_fpu).fpr[wd] = (fpr_t)(auVar3 & auVar23 & _DAT_00d83330 | ~auVar23 & auVar1);
  return;
}

Assistant:

void helper_msa_srl_b(CPUMIPSState *env,
                      uint32_t wd, uint32_t ws, uint32_t wt)
{
    wr_t *pwd = &(env->active_fpu.fpr[wd].wr);
    wr_t *pws = &(env->active_fpu.fpr[ws].wr);
    wr_t *pwt = &(env->active_fpu.fpr[wt].wr);

    pwd->b[0]  = msa_srl_df(DF_BYTE, pws->b[0],  pwt->b[0]);
    pwd->b[1]  = msa_srl_df(DF_BYTE, pws->b[1],  pwt->b[1]);
    pwd->b[2]  = msa_srl_df(DF_BYTE, pws->b[2],  pwt->b[2]);
    pwd->b[3]  = msa_srl_df(DF_BYTE, pws->b[3],  pwt->b[3]);
    pwd->b[4]  = msa_srl_df(DF_BYTE, pws->b[4],  pwt->b[4]);
    pwd->b[5]  = msa_srl_df(DF_BYTE, pws->b[5],  pwt->b[5]);
    pwd->b[6]  = msa_srl_df(DF_BYTE, pws->b[6],  pwt->b[6]);
    pwd->b[7]  = msa_srl_df(DF_BYTE, pws->b[7],  pwt->b[7]);
    pwd->b[8]  = msa_srl_df(DF_BYTE, pws->b[8],  pwt->b[8]);
    pwd->b[9]  = msa_srl_df(DF_BYTE, pws->b[9],  pwt->b[9]);
    pwd->b[10] = msa_srl_df(DF_BYTE, pws->b[10], pwt->b[10]);
    pwd->b[11] = msa_srl_df(DF_BYTE, pws->b[11], pwt->b[11]);
    pwd->b[12] = msa_srl_df(DF_BYTE, pws->b[12], pwt->b[12]);
    pwd->b[13] = msa_srl_df(DF_BYTE, pws->b[13], pwt->b[13]);
    pwd->b[14] = msa_srl_df(DF_BYTE, pws->b[14], pwt->b[14]);
    pwd->b[15] = msa_srl_df(DF_BYTE, pws->b[15], pwt->b[15]);
}